

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledBitmap.h
# Opt level: O1

bool __thiscall SSD1306::OledBitmap<128,_64>::isSetPixel(OledBitmap<128,_64> *this,OledPoint p)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  
  bVar2 = OledPixel::pixelInside(&this->super_OledPixel,p);
  if (bVar2) {
    iVar1 = p.m_x;
    iVar3 = iVar1 + 7;
    if (-1 < iVar1) {
      iVar3 = iVar1;
    }
    bVar2 = ((this->blocks_)._M_elems[(long)p >> 0x20]._M_elems[iVar3 >> 3] >>
             ((byte)(7 - ((char)p.m_x - ((byte)iVar3 & 0xf8))) & 0x1f) & 1) != 0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
    isSetPixel(
        SSD1306::OledPoint p) const override
    {
        if (not pixelInside(p))
        {
            return false;
        }

        PixelOffset offset{p};

        return blocks_[offset.block][offset.byte] & (1 << offset.bit);
    }